

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int nni_msg_insert(nni_msg *m,void *data,size_t len)

{
  size_t *psVar1;
  uint8_t *puVar2;
  size_t __n;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  puVar2 = (m->m_body).ch_buf;
  puVar4 = (m->m_body).ch_ptr;
  if (puVar4 == (uint8_t *)0x0) {
    (m->m_body).ch_ptr = puVar2;
    puVar4 = puVar2;
LAB_001176ff:
    uVar5 = (m->m_body).ch_cap;
    if (puVar2 + uVar5 <= puVar4) goto LAB_00117727;
    if ((ulong)((long)puVar4 - (long)puVar2) < len) {
      __n = (m->m_body).ch_len;
      if (__n + len + 8 <= uVar5) {
        uVar5 = ((uVar5 - __n) - len >> 1) + 7 & 0xfffffffffffffff8;
        memmove(puVar2 + uVar5,puVar4,__n);
        puVar4 = (m->m_body).ch_buf + uVar5;
        goto LAB_00117742;
      }
      goto LAB_00117727;
    }
  }
  else {
    if (puVar2 <= puVar4) goto LAB_001176ff;
LAB_00117727:
    iVar3 = nni_chunk_grow(&m->m_body,0,len);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar4 = (m->m_body).ch_ptr;
  }
  puVar4 = puVar4 + -len;
LAB_00117742:
  (m->m_body).ch_ptr = puVar4;
  psVar1 = &(m->m_body).ch_len;
  *psVar1 = *psVar1 + len;
  if (data != (void *)0x0) {
    memcpy(puVar4,data,len);
  }
  return 0;
}

Assistant:

int
nni_msg_insert(nni_msg *m, const void *data, size_t len)
{
	return (nni_chunk_insert(&m->m_body, data, len));
}